

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O1

sunindextype GlobalVectorLength_BandLS(N_Vector y)

{
  N_Vector z;
  sunindextype sVar1;
  realtype rVar2;
  
  z = N_VClone(y);
  if (z == (N_Vector)0x0) {
    sVar1 = -1;
  }
  else {
    N_VConst(1.0,z);
    rVar2 = N_VDotProd(z,z);
    N_VDestroy(z);
    sVar1 = (sunindextype)rVar2;
  }
  return sVar1;
}

Assistant:

sunindextype GlobalVectorLength_BandLS(N_Vector y)
{
  realtype len;
  N_Vector tmp = NULL;
  tmp = N_VClone(y);
  if (tmp == NULL)  return(-1);
  N_VConst(ONE, tmp);
  len = N_VDotProd(tmp, tmp);
  N_VDestroy(tmp);
  return( (sunindextype) len );
}